

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Graph_t * Kit_GraphCreateConst0(void)

{
  Kit_Graph_t *__s;
  Kit_Graph_t *pGraph;
  
  __s = (Kit_Graph_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->fConst = 1;
  __s->eRoot = (Kit_Edge_t)((uint)__s->eRoot & 0xfffffffe | 1);
  return __s;
}

Assistant:

Kit_Graph_t * Kit_GraphCreateConst0()   
{
    Kit_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Kit_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Kit_Graph_t) );
    pGraph->fConst = 1;
    pGraph->eRoot.fCompl = 1;
    return pGraph;
}